

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex_nivalis_conv.cpp
# Opt level: O2

string * __thiscall
nivalis::anon_unknown_1::ParenRule::operator()
          (string *__return_storage_ptr__,ParenRule *this,string *s)

{
  size_t i;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  allocator_type local_59;
  string tmp;
  vector<unsigned_long,_std::allocator<unsigned_long>_> za;
  
  if (s->_M_string_length < (this->prefix)._M_string_length) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  }
  else {
    std::__cxx11::string::string((string *)&tmp,(string *)this);
    std::__cxx11::string::push_back((char)&tmp);
    std::__cxx11::string::append((string *)&tmp);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&za,tmp._M_string_length,&local_59);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(&za,tmp._M_string_length);
    *za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = tmp._M_string_length;
    uVar2 = 0;
    uVar3 = 0;
    for (uVar1 = 1; uVar1 < tmp._M_string_length; uVar1 = uVar1 + 1) {
      if ((uVar2 < uVar1) ||
         ((uVar2 - uVar1) + 1 <=
          za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[uVar1 - uVar3])) {
        if (uVar2 < uVar1) {
          uVar2 = uVar1;
        }
        for (; uVar2 < tmp._M_string_length; uVar2 = uVar2 + 1) {
          uVar4 = uVar2 - uVar1;
          if (tmp._M_dataplus._M_p[uVar2] != tmp._M_dataplus._M_p[uVar4]) goto LAB_0011301b;
        }
        uVar4 = uVar2 - uVar1;
LAB_0011301b:
        za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] = uVar4;
        uVar2 = uVar2 - 1;
        uVar3 = uVar1;
      }
      else {
        za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar1] =
             za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar1 - uVar3];
      }
    }
    _replace(__return_storage_ptr__,this,s,0,s->_M_string_length,&za);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&za.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::__cxx11::string::~string((string *)&tmp);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string operator()(const std::string & s) const {
        if (s.size() < prefix.size()) return s;
        std::string tmp = prefix; tmp.push_back('\v'); tmp.append(s);
        std::vector<size_t> za(tmp.size());
        za.resize(tmp.size());
        za[0] = tmp.size();
        size_t left = 0, right = 0;
        for (size_t i = 1; i < tmp.size(); ++i) {
            if (right >= i && size_t(za[i - left]) < right - i + 1) za[i] = za[i - left];
            else {
                left = i; right = std::max(i, right);
                while (right < tmp.size() && tmp[right] == tmp[right - left]) ++right;
                za[i] = right - left; --right;
            }
        }
        return _replace(s, 0, s.size(), za);
    }